

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O0

void __thiscall polyscope::CurveNetwork::drawDelayed(CurveNetwork *this)

{
  bool bVar1;
  pointer pCVar2;
  pointer pFVar3;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>_>_>
  *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>_>
  *x_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>_>_>_>
  *__range1_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>_>
  *x;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  _Self local_40;
  _Self local_38;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>_>_>
  *local_30;
  reference local_28;
  _Self local_20;
  _Self local_18;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>_>_>
  *local_10;
  
  bVar1 = Structure::isEnabled((Structure *)0x4abef8);
  if (bVar1) {
    local_10 = in_RDI + 0x78;
    local_18._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>_>_>_>
                  *)in_stack_ffffffffffffffa8);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>_>_>_>
                *)in_stack_ffffffffffffffa8);
    while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
      local_28 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>_>_>
                              *)0x4abf4e);
      pCVar2 = std::
               unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>
               ::operator->((unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>
                             *)0x4abf61);
      (*(pCVar2->super_QuantityS<polyscope::CurveNetwork>).super_Quantity._vptr_Quantity[3])();
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::CurveNetworkQuantity,_std::default_delete<polyscope::CurveNetworkQuantity>_>_>_>
      ::operator++(in_RDI);
    }
    local_30 = in_RDI + 0x7f;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>_>_>_>
         ::begin(in_stack_ffffffffffffffa8);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>_>_>_>
         ::end(in_stack_ffffffffffffffa8);
    while (bVar1 = std::operator!=(&local_38,&local_40), bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>_>_>
                   *)0x4abfc3);
      pFVar3 = std::
               unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>
               ::operator->((unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>
                             *)0x4abfd6);
      (**(code **)(*(long *)pFVar3 + 0x18))();
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::FloatingQuantity,_std::default_delete<polyscope::FloatingQuantity>_>_>_>
                    *)in_RDI);
    }
  }
  return;
}

Assistant:

void CurveNetwork::drawDelayed() {
  if (!isEnabled()) {
    return;
  }

  for (auto& x : quantities) {
    x.second->drawDelayed();
  }
  for (auto& x : floatingQuantities) {
    x.second->drawDelayed();
  }
}